

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcSphere::IfcSphere(IfcSphere *this)

{
  *(undefined ***)&this->field_0x50 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x58 = 0;
  *(char **)&this->field_0x60 = "IfcSphere";
  IfcCsgPrimitive3D::IfcCsgPrimitive3D
            (&this->super_IfcCsgPrimitive3D,&PTR_construction_vtable_24__0089b5e0);
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x40 = 0;
  (this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x89b528;
  *(undefined8 *)&this->field_0x50 = 0x89b5c8;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x89b550;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x89b578;
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x38 = 0x89b5a0;
  return;
}

Assistant:

IfcSphere() : Object("IfcSphere") {}